

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall duckdb::BaseAppender::Append(BaseAppender *this,char *value,uint32_t length)

{
  string_t input;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 local_14;
  
  if (length < 0xd) {
    local_14 = 0;
    uStack_1c = 0;
    uStack_18 = 0;
    if (length == 0) {
      value = (char *)0x0;
    }
    else {
      switchD_01939fa4::default(&uStack_1c,value,(ulong)length);
      value = (char *)CONCAT44(local_14,uStack_18);
    }
  }
  else {
    uStack_1c = *(undefined4 *)value;
  }
  input.value._4_1_ = (undefined1)uStack_1c;
  input.value._5_1_ = uStack_1c._1_1_;
  input.value._6_1_ = uStack_1c._2_1_;
  input.value._7_1_ = uStack_1c._3_1_;
  input.value.pointer.length = length;
  input.value.pointer.ptr = value;
  AppendValueInternal<duckdb::string_t>(this,input);
  return;
}

Assistant:

void BaseAppender::Append(const char *value, uint32_t length) {
	AppendValueInternal<string_t>(string_t(value, length));
}